

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-map.c
# Opt level: O2

void cave_room_aux(point_set *seen,loc grid)

{
  _Bool _Var1;
  int iVar2;
  
  iVar2 = point_set_contains((point_set_conflict *)seen,(loc_conflict)grid);
  if (iVar2 == 0) {
    _Var1 = square_in_bounds(cave,grid);
    if (_Var1) {
      _Var1 = square_isroom(cave,grid);
      if (_Var1) {
        add_to_point_set((point_set_conflict *)seen,(loc_conflict)grid);
        return;
      }
    }
  }
  return;
}

Assistant:

static void cave_room_aux(struct point_set *seen, struct loc grid)
{
	if (point_set_contains(seen, grid))
		return;

	if (!square_in_bounds(cave, grid))
		return;

	if (!square_isroom(cave, grid))
		return;

	/* Add it to the "seen" set */
	add_to_point_set(seen, grid);
}